

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O0

JavascriptString * __thiscall
Js::JavascriptStaticEnumerator::MoveAndGetNext
          (JavascriptStaticEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ScriptContext *requestContext;
  undefined4 *puVar4;
  JavascriptString *local_28;
  JavascriptString *currentIndex;
  PropertyAttributes *attributes_local;
  PropertyId *propertyId_local;
  JavascriptStaticEnumerator *this_local;
  
  local_28 = MoveAndGetNextFromEnumerator(this,propertyId,attributes);
  if (local_28 == (JavascriptString *)0x0) {
    local_28 = DynamicObjectPropertyEnumerator::MoveAndGetNext
                         (&this->propertyEnumerator,propertyId,attributes);
  }
  if (local_28 != (JavascriptString *)0x0) {
    requestContext = DynamicObjectPropertyEnumerator::GetScriptContext(&this->propertyEnumerator);
    BVar3 = CrossSite::NeedMarshalVar(local_28,requestContext);
    if (BVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/JavascriptStaticEnumerator.cpp"
                                  ,0x5a,
                                  "(!currentIndex || !CrossSite::NeedMarshalVar(currentIndex, this->propertyEnumerator.GetScriptContext()))"
                                  ,
                                  "!currentIndex || !CrossSite::NeedMarshalVar(currentIndex, this->propertyEnumerator.GetScriptContext())"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  return local_28;
}

Assistant:

JavascriptString * JavascriptStaticEnumerator::MoveAndGetNext(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        JavascriptString * currentIndex = MoveAndGetNextFromEnumerator(propertyId, attributes);
        if (currentIndex == nullptr)
        {
            currentIndex = propertyEnumerator.MoveAndGetNext(propertyId, attributes);
        }
        Assert(!currentIndex || !CrossSite::NeedMarshalVar(currentIndex, this->propertyEnumerator.GetScriptContext()));
        return currentIndex;
    }